

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O0

Vec_Ptr_t * Gia_ManMultiProveAig(Aig_Man_t *p,Bmc_MulPar_t *pPars)

{
  long lVar1;
  long lVar2;
  int nTotalPo_00;
  int nTotalSize_00;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  abctime clkStart_00;
  abctime aVar7;
  Vec_Int_t *vOutMap_00;
  Vec_Ptr_t *p_00;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Aig_Man_t *pAVar10;
  char *pFileName_00;
  long local_178;
  char *pFileName;
  int nSolved;
  int RetValue;
  int i;
  int TimeOutLoc;
  int nTotalSize;
  int nTotalPo;
  abctime nTimeToStop;
  abctime clkStart;
  Aig_Man_t *pTemp;
  Vec_Ptr_t *vCexes;
  Vec_Int_t *vLeftOver;
  Vec_Int_t *vOutMap;
  Saig_ParBmc_t *pParsBmc;
  Saig_ParBmc_t ParsBmc;
  Ssw_RarPars_t *pParsSim;
  Ssw_RarPars_t ParsSim;
  Bmc_MulPar_t *pPars_local;
  Aig_Man_t *p_local;
  
  ParsBmc.pFuncStop = (_func_int_int *)&pParsSim;
  ParsSim.pFuncOnFail = (_func_int_int_Abc_Cex_t_ptr *)pPars;
  clkStart_00 = Abc_Clock();
  if (*(int *)ParsSim.pFuncOnFail == 0) {
    local_178 = 0;
  }
  else {
    aVar7 = Abc_Clock();
    local_178 = aVar7 + (long)*(int *)ParsSim.pFuncOnFail * 1000000;
  }
  nTotalPo_00 = Saig_ManPoNum(p);
  nTotalSize_00 = Aig_ManObjNum(p);
  RetValue = *(int *)(ParsSim.pFuncOnFail + 4);
  if (*(int *)(ParsSim.pFuncOnFail + 0x1c) != 0) {
    printf("MultiProve parameters: Global timeout = %d sec.  Local timeout = %d sec.  Time increase = %d %%.\n"
           ,(ulong)*(uint *)ParsSim.pFuncOnFail,(ulong)*(uint *)(ParsSim.pFuncOnFail + 4));
  }
  if (*(int *)(ParsSim.pFuncOnFail + 0x1c) != 0) {
    printf("Gap timout = %d sec. Per-output timeout = %d msec. Use synthesis = %d. Dump final = %d. Verbose = %d.\n"
           ,(ulong)*(uint *)(ParsSim.pFuncOnFail + 0xc),(ulong)*(uint *)(ParsSim.pFuncOnFail + 0x10)
           ,(ulong)*(uint *)(ParsSim.pFuncOnFail + 0x14),
           (ulong)*(uint *)(ParsSim.pFuncOnFail + 0x18),(ulong)*(uint *)(ParsSim.pFuncOnFail + 0x1c)
          );
  }
  iVar3 = Saig_ManPoNum(p);
  vOutMap_00 = Vec_IntStartNatural(iVar3);
  iVar3 = Saig_ManPoNum(p);
  p_00 = Vec_PtrStart(iVar3);
  nSolved = 0;
  pPars_local = (Bmc_MulPar_t *)p;
  do {
    if (999 < nSolved) {
LAB_00718108:
      Vec_IntFree(vOutMap_00);
      if (*(int *)(ParsSim.pFuncOnFail + 0x1c) != 0) {
        uVar6 = Gia_ManCountConst0Pos((Aig_Man_t *)pPars_local);
        printf("The number of POs proved UNSAT by synthesis = %d.\n",(ulong)uVar6);
      }
      if (*(int *)(ParsSim.pFuncOnFail + 0x18) != 0) {
        pFileName_00 = Extra_FileNameGenericAppend(*(char **)pPars_local,"_out.aig");
        Ioa_WriteAiger((Aig_Man_t *)pPars_local,pFileName_00,0,0);
        printf("Final AIG was dumped into file \"%s\".\n",pFileName_00);
      }
      Aig_ManStop((Aig_Man_t *)pPars_local);
      return p_00;
    }
    iVar3 = Vec_PtrCountZero(p_00);
    Ssw_RarSetDefaultParams((Ssw_RarPars_t *)ParsBmc.pFuncStop);
    *(undefined4 *)(ParsBmc.pFuncStop + 0x20) = 1;
    *(undefined4 *)(ParsBmc.pFuncStop + 0x2c) = 1;
    *(uint *)(ParsBmc.pFuncStop + 0x30) =
         (uint)((*(int *)(ParsSim.pFuncOnFail + 0x20) != 0 ^ 0xffU) & 1);
    *(int *)(ParsBmc.pFuncStop + 0x18) = RetValue;
    *(int *)(ParsBmc.pFuncStop + 0x14) = (nSolved * 0x11) % 500;
    *(undefined4 *)(ParsBmc.pFuncStop + 4) = 5;
    Ssw_RarSimulate((Aig_Man_t *)pPars_local,(Ssw_RarPars_t *)ParsBmc.pFuncStop);
    lVar1._0_4_ = pPars_local[0xb].fUseSyn;
    lVar1._4_4_ = pPars_local[0xb].fDumpFinal;
    if (lVar1 != 0) {
      pVVar8 = Gia_ManProcessOutputs(*(Vec_Ptr_t **)&pPars_local[0xb].fUseSyn,p_00,vOutMap_00);
      iVar4 = Vec_IntSize(pVVar8);
      if (iVar4 == 0) goto LAB_00718108;
      piVar9 = Vec_IntArray(pVVar8);
      iVar4 = Vec_IntSize(pVVar8);
      pAVar10 = Saig_ManDupCones((Aig_Man_t *)pPars_local,piVar9,iVar4);
      Vec_IntFree(pVVar8);
      Aig_ManStop((Aig_Man_t *)pPars_local);
      pPars_local = (Bmc_MulPar_t *)pAVar10;
    }
    if (*(int *)(ParsSim.pFuncOnFail + 0x1c) != 0) {
      Gia_ManMultiReport((Aig_Man_t *)pPars_local,"SIM",nTotalPo_00,nTotalSize_00,clkStart_00);
    }
    if ((local_178 != 0) && (aVar7 = Abc_Clock(), local_178 < aVar7 + (long)RetValue * 1000000)) {
      printf("Global timeout (%d sec) is reached.\n",(ulong)*(uint *)ParsSim.pFuncOnFail);
      goto LAB_00718108;
    }
    Saig_ParBmcSetDefaultParams((Saig_ParBmc_t *)&pParsBmc);
    ParsBmc.nTimeOutOne = 1;
    ParsBmc.nLearnedPerce = 1;
    ParsBmc.pLogFileName._0_4_ = (uint)((*(int *)(ParsSim.pFuncOnFail + 0x20) != 0 ^ 0xffU) & 1);
    ParsBmc.nConfLimitJump = RetValue;
    ParsBmc.nTimeOut = *(int *)(ParsSim.pFuncOnFail + 0x10);
    Saig_ManBmcScalable((Aig_Man_t *)pPars_local,(Saig_ParBmc_t *)&pParsBmc);
    if (*(int *)(ParsSim.pFuncOnFail + 0x20) != 0) {
      iVar4 = Saig_ManPoNum((Aig_Man_t *)pPars_local);
      iVar5 = Vec_PtrCountZero(*(Vec_Ptr_t **)&pPars_local[0xb].fUseSyn);
      uVar6 = Saig_ManPoNum((Aig_Man_t *)pPars_local);
      Abc_Print(1,"Some outputs are SAT (%d out of %d) after %d frames.\n",
                (ulong)(uint)(iVar4 - iVar5),(ulong)uVar6,(ulong)ParsBmc.pLogFileName._4_4_);
    }
    lVar2._0_4_ = pPars_local[0xb].fUseSyn;
    lVar2._4_4_ = pPars_local[0xb].fDumpFinal;
    if (lVar2 != 0) {
      pVVar8 = Gia_ManProcessOutputs(*(Vec_Ptr_t **)&pPars_local[0xb].fUseSyn,p_00,vOutMap_00);
      iVar4 = Vec_IntSize(pVVar8);
      if (iVar4 == 0) goto LAB_00718108;
      piVar9 = Vec_IntArray(pVVar8);
      iVar4 = Vec_IntSize(pVVar8);
      pAVar10 = Saig_ManDupCones((Aig_Man_t *)pPars_local,piVar9,iVar4);
      Vec_IntFree(pVVar8);
      Aig_ManStop((Aig_Man_t *)pPars_local);
      pPars_local = (Bmc_MulPar_t *)pAVar10;
    }
    if (*(int *)(ParsSim.pFuncOnFail + 0x1c) != 0) {
      Gia_ManMultiReport((Aig_Man_t *)pPars_local,"BMC",nTotalPo_00,nTotalSize_00,clkStart_00);
    }
    if ((local_178 != 0) && (aVar7 = Abc_Clock(), local_178 < aVar7 + (long)RetValue * 1000000)) {
      printf("Global timeout (%d sec) is reached.\n",(ulong)*(uint *)ParsSim.pFuncOnFail);
      goto LAB_00718108;
    }
    if (((*(int *)(ParsSim.pFuncOnFail + 0xc) != 0) &&
        (*(int *)(ParsSim.pFuncOnFail + 0xc) <= RetValue)) &&
       (iVar4 = Vec_PtrCountZero(p_00), iVar3 == iVar4)) {
      printf("Gap timeout (%d sec) is reached.\n",(ulong)*(uint *)(ParsSim.pFuncOnFail + 0xc));
      goto LAB_00718108;
    }
    if (*(int *)(ParsSim.pFuncOnFail + 0x14) != 0) {
      pAVar10 = Gia_ManMultiProveSyn
                          ((Aig_Man_t *)pPars_local,*(int *)(ParsSim.pFuncOnFail + 0x1c),
                           *(int *)(ParsSim.pFuncOnFail + 0x20));
      Aig_ManStop((Aig_Man_t *)pPars_local);
      pPars_local = (Bmc_MulPar_t *)pAVar10;
      if (*(int *)(ParsSim.pFuncOnFail + 0x1c) != 0) {
        Gia_ManMultiReport(pAVar10,"SYN",nTotalPo_00,nTotalSize_00,clkStart_00);
      }
    }
    RetValue = (RetValue * *(int *)(ParsSim.pFuncOnFail + 8)) / 100 + RetValue;
    nSolved = nSolved + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Gia_ManMultiProveAig( Aig_Man_t * p, Bmc_MulPar_t * pPars )
{
    Ssw_RarPars_t ParsSim, * pParsSim = &ParsSim;
    Saig_ParBmc_t ParsBmc, * pParsBmc = &ParsBmc;
    Vec_Int_t * vOutMap, * vLeftOver;
    Vec_Ptr_t * vCexes;
    Aig_Man_t * pTemp;
    abctime clkStart = Abc_Clock();
    abctime nTimeToStop = pPars->TimeOutGlo ? Abc_Clock() + pPars->TimeOutGlo * CLOCKS_PER_SEC : 0;
    int nTotalPo     = Saig_ManPoNum(p);
    int nTotalSize   = Aig_ManObjNum(p);
    int TimeOutLoc   = pPars->TimeOutLoc;
    int i, RetValue  = -1;
    if ( pPars->fVerbose )
        printf( "MultiProve parameters: Global timeout = %d sec.  Local timeout = %d sec.  Time increase = %d %%.\n", 
            pPars->TimeOutGlo, pPars->TimeOutLoc, pPars->TimeOutInc );
    if ( pPars->fVerbose )
        printf( "Gap timout = %d sec. Per-output timeout = %d msec. Use synthesis = %d. Dump final = %d. Verbose = %d.\n", 
            pPars->TimeOutGap, pPars->TimePerOut, pPars->fUseSyn, pPars->fDumpFinal, pPars->fVerbose );
    // create output map
    vOutMap = Vec_IntStartNatural( Saig_ManPoNum(p) ); // maps current outputs into their original IDs
    vCexes  = Vec_PtrStart( Saig_ManPoNum(p) );        // maps solved outputs into their CEXes (or markers)
    for ( i = 0; i < 1000; i++ )
    {
        int nSolved = Vec_PtrCountZero(vCexes);
        // perform SIM3
        Ssw_RarSetDefaultParams( pParsSim );
        pParsSim->fSolveAll = 1;
        pParsSim->fNotVerbose = 1;
        pParsSim->fSilent = !pPars->fVeryVerbose;
        pParsSim->TimeOut = TimeOutLoc;
        pParsSim->nRandSeed = (i * 17) % 500;
        pParsSim->nWords = 5;
        RetValue *= Ssw_RarSimulate( p, pParsSim );
        // sort outputs
        if ( p->vSeqModelVec )
        {
            vLeftOver = Gia_ManProcessOutputs( p->vSeqModelVec, vCexes, vOutMap );
            if ( Vec_IntSize(vLeftOver) == 0 )
                break;
            // remove solved        
            p = Saig_ManDupCones( pTemp = p, Vec_IntArray(vLeftOver), Vec_IntSize(vLeftOver) );
            Vec_IntFree( vLeftOver );
            Aig_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
            Gia_ManMultiReport( p, "SIM", nTotalPo, nTotalSize, clkStart );

        // check timeout
        if ( nTimeToStop && Abc_Clock() + TimeOutLoc * CLOCKS_PER_SEC > nTimeToStop )
        {
            printf( "Global timeout (%d sec) is reached.\n", pPars->TimeOutGlo );
            break;
        }

        // perform BMC
        Saig_ParBmcSetDefaultParams( pParsBmc );
        pParsBmc->fSolveAll = 1;
        pParsBmc->fNotVerbose = 1;
        pParsBmc->fSilent = !pPars->fVeryVerbose;
        pParsBmc->nTimeOut = TimeOutLoc;
        pParsBmc->nTimeOutOne = pPars->TimePerOut;
        RetValue *= Saig_ManBmcScalable( p, pParsBmc );
        if ( pPars->fVeryVerbose )
            Abc_Print( 1, "Some outputs are SAT (%d out of %d) after %d frames.\n", 
                Saig_ManPoNum(p) - Vec_PtrCountZero(p->vSeqModelVec), Saig_ManPoNum(p), pParsBmc->iFrame );
        // sort outputs
        if ( p->vSeqModelVec )
        {
            vLeftOver = Gia_ManProcessOutputs( p->vSeqModelVec, vCexes, vOutMap );
            if ( Vec_IntSize(vLeftOver) == 0 )
                break;
            // remove solved        
            p = Saig_ManDupCones( pTemp = p, Vec_IntArray(vLeftOver), Vec_IntSize(vLeftOver) );
            Vec_IntFree( vLeftOver );
            Aig_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
            Gia_ManMultiReport( p, "BMC", nTotalPo, nTotalSize, clkStart );

        // check timeout
        if ( nTimeToStop && Abc_Clock() + TimeOutLoc * CLOCKS_PER_SEC > nTimeToStop )
        {
            printf( "Global timeout (%d sec) is reached.\n", pPars->TimeOutGlo );
            break;
        }

        // check gap timeout
        if ( pPars->TimeOutGap && pPars->TimeOutGap <= TimeOutLoc && nSolved == Vec_PtrCountZero(vCexes) )
        {
            printf( "Gap timeout (%d sec) is reached.\n", pPars->TimeOutGap );
            break;
        }

        // synthesize
        if ( pPars->fUseSyn )
        {
            p = Gia_ManMultiProveSyn( pTemp = p, pPars->fVerbose, pPars->fVeryVerbose );
            Aig_ManStop( pTemp );
            if ( pPars->fVerbose )
                Gia_ManMultiReport( p, "SYN", nTotalPo, nTotalSize, clkStart );
        }

        // increase timeout
        TimeOutLoc += TimeOutLoc * pPars->TimeOutInc / 100;
    }
    Vec_IntFree( vOutMap );
    if ( pPars->fVerbose )
        printf( "The number of POs proved UNSAT by synthesis = %d.\n", Gia_ManCountConst0Pos(p) );
    if ( pPars->fDumpFinal )
    {
        char * pFileName = Extra_FileNameGenericAppend( p->pName, "_out.aig" );
        Ioa_WriteAiger( p, pFileName, 0, 0 );
        printf( "Final AIG was dumped into file \"%s\".\n", pFileName );
    }
    Aig_ManStop( p );
    return vCexes;
}